

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::ExcludedPattern::ExcludedPattern
          (ExcludedPattern *this,PatternPtr *underlyingPattern)

{
  shared_ptr<Catch::TestSpec::Pattern> *in_RSI;
  shared_ptr<Catch::TestSpec::Pattern> *in_RDI;
  
  Pattern::Pattern((Pattern *)in_RDI);
  (in_RDI->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__ExcludedPattern_002645d0;
  clara::std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr(in_RSI,in_RDI);
  return;
}

Assistant:

TestSpec::ExcludedPattern::ExcludedPattern( PatternPtr const& underlyingPattern ) : m_underlyingPattern( underlyingPattern ) {}